

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

bool cmProjectCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  PolicyStatus PVar5;
  int iVar6;
  long *plVar7;
  string *psVar8;
  cmValue cVar9;
  undefined8 uVar10;
  _Map_pointer ppvVar11;
  uint7 extraout_var_00;
  undefined8 *puVar12;
  long *plVar13;
  PolicyID extraout_EDX;
  char *pcVar14;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID id;
  undefined1 *puVar15;
  long lVar16;
  ulong uVar17;
  cmMakefile *pcVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  byte bVar20;
  pointer pbVar21;
  bool bVar22;
  byte bVar23;
  ulong uVar24;
  _Base_ptr p_Var25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  string *i;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view value_10;
  string_view value_11;
  string_view value_12;
  string_view value_13;
  string_view value_14;
  string_view value_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  uint v [4];
  string msg;
  string version_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  version_components;
  string homepage;
  string description;
  string version;
  undefined1 local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  cmMakefile *local_310;
  _Any_data local_308;
  _Map_pointer local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_2f0;
  string local_2e8;
  string local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined1 local_248 [16];
  pointer local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [16];
  __node_base local_1f8;
  _Hash_node_base local_1e8 [2];
  __node_base *local_1d8;
  int local_1d0;
  __node_base local_1c8 [2];
  _Base_ptr local_1b8 [2];
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  undefined1 local_188 [16];
  _Base_ptr local_178 [2];
  undefined1 local_168 [24];
  _Base_ptr local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  undefined8 uStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  string local_c8;
  ulong local_a8;
  pointer local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  cmExecutionStatus *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  uint7 extraout_var;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"PROJECT called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    return false;
  }
  local_310 = status->Makefile;
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,"CMAKE_PROJECT_INCLUDE_BEFORE","");
  bVar2 = IncludeByVariable(status,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  if (!bVar2) {
    return false;
  }
  local_318 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  std::operator+(&local_128,"CMAKE_PROJECT_",local_318);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
  plVar13 = plVar7 + 2;
  if ((long *)*plVar7 == plVar13) {
    local_288._0_8_ = *plVar13;
    local_288._8_8_ = plVar7[3];
    local_298._0_8_ = local_288;
  }
  else {
    local_288._0_8_ = *plVar13;
    local_298._0_8_ = (long *)*plVar7;
  }
  local_298._8_8_ = plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  bVar2 = IncludeByVariable(status,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  pcVar18 = local_310;
  pbVar26 = local_318;
  if (!bVar2) {
    return false;
  }
  local_58 = status;
  cmMakefile::SetProjectName(local_310,local_318);
  pcVar1 = (pbVar26->_M_dataplus)._M_p;
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + pbVar26->_M_string_length);
  std::__cxx11::string::append((char *)local_298);
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar18);
  cmMakefile::AddCacheDefinition
            (pcVar18,(string *)local_298,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC
             ,false);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  pcVar1 = (local_318->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + local_318->_M_string_length);
  std::__cxx11::string::append((char *)local_298);
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar18);
  cmMakefile::AddCacheDefinition
            (pcVar18,(string *)local_298,(psVar8->_M_dataplus)._M_p,"Value Computed by CMake",STATIC
             ,false);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_BINARY_DIR","");
  psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar18);
  value._M_str = (psVar8->_M_dataplus)._M_p;
  value._M_len = psVar8->_M_string_length;
  cmMakefile::AddDefinition(pcVar18,(string *)local_298,value);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_SOURCE_DIR","");
  psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar18);
  value_00._M_str = (psVar8->_M_dataplus)._M_p;
  value_00._M_len = psVar8->_M_string_length;
  cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_00);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_NAME","");
  value_01._M_str = (local_318->_M_dataplus)._M_p;
  value_01._M_len = local_318->_M_string_length;
  cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_01);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_IS_TOP_LEVEL","");
  bVar2 = cmMakefile::IsRootMakefile(pcVar18);
  cmMakefile::AddDefinitionBool(pcVar18,(string *)local_298,bVar2);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = local_288;
  pcVar1 = (local_318->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_298,pcVar1,pcVar1 + local_318->_M_string_length);
  std::__cxx11::string::append((char *)local_298);
  bVar2 = cmMakefile::IsRootMakefile(pcVar18);
  pcVar14 = "OFF";
  if (bVar2) {
    pcVar14 = "ON";
  }
  cmMakefile::AddCacheDefinition
            (pcVar18,(string *)local_298,pcVar14,"Value Computed by CMake",STATIC,false);
  if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_298._0_8_ = (cmMakefile *)local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_PROJECT_NAME","");
  cVar9 = cmMakefile::GetDefinition(pcVar18,(string *)local_298);
  if (cVar9.Value == (string *)0x0) {
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
LAB_00344c3a:
    local_298._0_8_ = (cmMakefile *)local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_PROJECT_NAME","");
    cmMakefile::RemoveDefinition(pcVar18,(string *)local_298);
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    local_298._0_8_ = (cmMakefile *)local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_PROJECT_NAME","");
    cmMakefile::AddCacheDefinition
              (pcVar18,(string *)local_298,(local_318->_M_dataplus)._M_p,"Value Computed by CMake",
               STATIC,false);
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
  }
  else {
    bVar2 = cmMakefile::IsRootMakefile(pcVar18);
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    if (bVar2) goto LAB_00344c3a;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78._M_allocated_capacity = (size_type)&local_68;
  local_78._8_8_ = (pointer)0x0;
  local_68._M_local_buf[0] = '\0';
  local_98._0_8_ = local_98 + 0x10;
  local_98._8_8_ = (pointer)0x0;
  local_98[0x10] = '\0';
  local_a0 = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._16_8_ = &local_308;
  local_2f8 = (_Map_pointer)0x0;
  paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_308._M_unused._M_object = (cmMakefile *)0x0;
  local_308._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  pbVar21 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar23 = 0;
  bVar22 = false;
  bVar2 = false;
  bVar20 = 0;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21)) {
    iVar6 = 2;
    lVar16 = 0x20;
    local_150 = (_Base_ptr)0x0;
    bVar2 = false;
    bVar22 = false;
    local_a8 = 0;
    local_a0 = (pointer)0x0;
    uVar24 = 1;
    do {
      iVar4 = std::__cxx11::string::compare((char *)((long)&(pbVar21->_M_dataplus)._M_p + lVar16));
      if (iVar4 == 0) {
        if (bVar2) {
          local_298._0_8_ = local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"LANGUAGES may be specified at most once.","");
          cmMakefile::IssueMessage(local_310,FATAL_ERROR,(string *)local_298);
          goto LAB_003460a3;
        }
        if (local_2f8 != (_Map_pointer)0x0) {
          (*(code *)paStack_2f0)(&local_308);
        }
        bVar2 = true;
        iVar6 = 2;
        if (local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_148.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          separator._M_str = ", ";
          separator._M_len = 2;
          cmJoin(&local_2b8,&local_148,separator,(string_view)ZEXT816(0));
          local_298._0_8_ = &DAT_00000044;
          local_298._8_8_ = "the following parameters must be specified after LANGUAGES keyword: ";
          local_288._0_8_ = local_2b8._M_string_length;
          local_288._8_8_ = local_2b8._M_dataplus._M_p;
          local_128._M_dataplus._M_p = &DAT_00000001;
          local_278[1] = &local_128.field_2;
          local_128.field_2._M_local_buf[0] = 0x2e;
          local_278[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&DAT_00000001;
          views._M_len = 3;
          views._M_array = (iterator)local_298;
          local_128._M_string_length = (size_type)local_278[1];
          cmCatViews_abi_cxx11_(&local_2e8,views);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                     local_2b8.field_2._M_local_buf[0]) + 1);
          }
          cmMakefile::IssueMessage(local_310,WARNING,&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      else {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar16));
        if (iVar4 == 0) {
          if (((ulong)local_150 & 1) != 0) {
            local_298._0_8_ = local_288;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,"VERSION may be specified at most once.","");
            cmMakefile::IssueMessage(local_310,FATAL_ERROR,(string *)local_298);
            goto LAB_003460a3;
          }
          if (local_2f8 != (_Map_pointer)0x0) {
            (*(code *)paStack_2f0)(&local_308);
          }
          ppvVar11 = local_2f8;
          local_298._0_8_ = local_308._M_unused._M_object;
          local_298._8_8_ = local_308._8_8_;
          local_308._M_unused._0_8_ = local_310;
          local_308._8_8_ = local_168 + 0x10;
          local_288._0_8_ = local_2f8;
          local_2f8 = (_Map_pointer)
                      std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                      ::_M_manager;
          local_288._8_8_ = paStack_2f0;
          paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:132:29)>
                           ::_M_invoke;
          if (ppvVar11 != (_Map_pointer)0x0) {
            (*(code *)ppvVar11)((_Any_data *)local_298,(_Any_data *)local_298,__destroy_functor);
            ppvVar11 = (_Map_pointer)((ulong)extraout_var << 8);
          }
          local_150 = (_Base_ptr)CONCAT71((int7)((ulong)ppvVar11 >> 8),1);
          iVar6 = 3;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar16));
          if (iVar4 == 0) {
            if (bVar22) {
              local_298._0_8_ = local_288;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"DESCRIPTION may be specified at most once.","");
              cmMakefile::IssueMessage(local_310,FATAL_ERROR,(string *)local_298);
              goto LAB_003460a3;
            }
            if (local_2f8 != (_Map_pointer)0x0) {
              (*(code *)paStack_2f0)(&local_308);
            }
            ppvVar11 = local_2f8;
            local_298._0_8_ = local_308._M_unused._M_object;
            local_298._8_8_ = local_308._8_8_;
            local_308._M_unused._0_8_ = local_310;
            local_308._8_8_ = local_168 + 0x10;
            local_288._0_8_ = local_2f8;
            local_2f8 = (_Map_pointer)
                        std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                        ::_M_manager;
            local_288._8_8_ = paStack_2f0;
            paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:151:29)>
                             ::_M_invoke;
            if (ppvVar11 != (_Map_pointer)0x0) {
              (*(code *)ppvVar11)((_Any_data *)local_298,(_Any_data *)local_298,__destroy_functor);
            }
            bVar22 = true;
            iVar6 = 0;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar16));
            ppvVar11 = local_2f8;
            if (iVar4 == 0) {
              if ((local_a8 & 1) != 0) {
                local_298._0_8_ = local_288;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_298,"HOMEPAGE_URL may be specified at most once.","");
                cmMakefile::IssueMessage(local_310,FATAL_ERROR,(string *)local_298);
                goto LAB_003460a3;
              }
              local_298._0_8_ = local_308._M_unused._M_object;
              local_298._8_8_ = local_308._8_8_;
              local_308._M_unused._M_object = local_310;
              local_308._8_8_ = local_168 + 0x10;
              local_288._0_8_ = local_2f8;
              local_2f8 = (_Map_pointer)
                          std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                          ::_M_manager;
              local_288._8_8_ = paStack_2f0;
              paStack_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmProjectCommand.cxx:167:29)>
                               ::_M_invoke;
              if (ppvVar11 != (_Map_pointer)0x0) {
                (*(code *)ppvVar11)((_Any_data *)local_298,(_Any_data *)local_298,__destroy_functor)
                ;
                ppvVar11 = (_Map_pointer)((ulong)extraout_var_00 << 8);
              }
              local_a8 = CONCAT71((int7)((ulong)ppvVar11 >> 8),1);
              iVar6 = 1;
            }
            else if ((uVar24 == 1) &&
                    (uVar10 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1)),
                    (int)uVar10 == 0)) {
              local_a0 = (pointer)CONCAT71((int7)((ulong)uVar10 >> 8),1);
            }
            else {
              if (iVar6 == 0) {
                std::__cxx11::string::_M_assign((string *)local_78._M_local_buf);
                local_288._0_8_ = (_Map_pointer)0x0;
                local_288._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_298._0_8_ = (cmMakefile *)0x0;
                local_298._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_168._16_8_,(function<void_()> *)local_298);
                if ((_Map_pointer)local_288._0_8_ != (_Map_pointer)0x0) {
                  (*(code *)local_288._0_8_)
                            ((function<void_()> *)local_298,(function<void_()> *)local_298,3);
                }
              }
              else if (iVar6 == 1) {
                std::__cxx11::string::_M_assign((string *)local_98);
                local_288._0_8_ = (_Map_pointer)0x0;
                local_288._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_298._0_8_ = (cmMakefile *)0x0;
                local_298._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_168._16_8_,(function<void_()> *)local_298);
                if ((_Map_pointer)local_288._0_8_ != (_Map_pointer)0x0) {
                  (*(code *)local_288._0_8_)
                            ((function<void_()> *)local_298,(function<void_()> *)local_298,3);
                }
              }
              else {
                if (iVar6 != 3) {
                  iVar6 = 2;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_148,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar16));
                  goto LAB_003452ba;
                }
                std::__cxx11::string::_M_assign((string *)&local_50);
                local_288._0_8_ = (_Map_pointer)0x0;
                local_288._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_298._0_8_ = (cmMakefile *)0x0;
                local_298._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                std::function<void_()>::operator=
                          ((function<void_()> *)local_168._16_8_,(function<void_()> *)local_298);
                if ((_Map_pointer)local_288._0_8_ != (_Map_pointer)0x0) {
                  (*(code *)local_288._0_8_)
                            ((function<void_()> *)local_298,(function<void_()> *)local_298,3);
                }
              }
              iVar6 = 2;
            }
          }
        }
      }
LAB_003452ba:
      uVar24 = uVar24 + 1;
      pbVar21 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x20;
    } while (uVar24 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar21 >> 5
                             ));
    bVar20 = (byte)local_150;
    bVar23 = (byte)local_a8;
    pcVar18 = local_310;
  }
  if (local_2f8 != (_Map_pointer)0x0) {
    (*(code *)paStack_2f0)(&local_308);
  }
  if (((~(bVar22 | bVar20 | bVar23) & 1) != 0 || bVar2) ||
     (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    if ((bVar2) &&
       (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[5]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 (char (*) [5])0x741d2c);
    }
    PVar5 = cmMakefile::GetPolicyStatus(pcVar18,CMP0048,false);
    if ((bVar20 & 1) == 0) {
      if (PVar5 != OLD) {
        local_298._0_8_ = local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_VERSION","");
        local_278[0] = &local_268;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_278,"PROJECT_VERSION_MAJOR","");
        local_258._M_allocated_capacity = (size_type)local_248;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"PROJECT_VERSION_MINOR","");
        local_238 = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_248 + 0x10),"PROJECT_VERSION_PATCH","");
        local_228.field_2._M_allocated_capacity = (size_type)local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&local_228 + 0x10),"PROJECT_VERSION_TWEAK","");
        local_1f8._M_nxt = local_1e8;
        pcVar1 = (local_318->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar1,pcVar1 + local_318->_M_string_length);
        std::__cxx11::string::append((char *)&local_1f8);
        local_1d8 = local_1c8;
        pcVar1 = (local_318->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar1,pcVar1 + local_318->_M_string_length);
        std::__cxx11::string::append((char *)&local_1d8);
        local_1b8[0] = (_Base_ptr)local_1a8;
        pcVar1 = (local_318->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,pcVar1,pcVar1 + local_318->_M_string_length);
        std::__cxx11::string::append((char *)local_1b8);
        local_198 = (_Base_ptr)local_188;
        pcVar1 = (local_318->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar1,pcVar1 + local_318->_M_string_length);
        std::__cxx11::string::append((char *)&local_198);
        p_Var25 = (_Base_ptr)local_168;
        pcVar1 = (local_318->_M_dataplus)._M_p;
        local_178[0] = p_Var25;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_178,pcVar1,pcVar1 + local_318->_M_string_length);
        std::__cxx11::string::append((char *)local_178);
        __l._M_len = 10;
        __l._M_array = (iterator)local_298;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_338,__l,(allocator_type *)&local_128);
        lVar16 = -0x140;
        do {
          if (p_Var25 != p_Var25[-1]._M_left) {
            operator_delete(p_Var25[-1]._M_left,
                            (ulong)((long)&(((((__uniq_ptr_data<cmSourceFile,_std::default_delete<cmSourceFile>,_true,_true>
                                                *)&p_Var25->_M_color)->
                                             super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                                             )._M_t.
                                             super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                                             .super__Head_base<0UL,_cmSourceFile_*,_false>.
                                            _M_head_impl)->Location).Makefile + 1));
          }
          p_Var25 = p_Var25 + -1;
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0);
        bVar2 = cmMakefile::IsRootMakefile(local_310);
        id = extraout_EDX;
        if (bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[22]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [22])"CMAKE_PROJECT_VERSION");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[28]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_338,
                     (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
          id = extraout_EDX_00;
        }
        uVar10 = local_338._8_8_;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        local_128._M_string_length = 0;
        local_128.field_2._M_allocated_capacity =
             local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (local_338._0_8_ != local_338._8_8_) {
          psVar8 = (string *)local_338._0_8_;
          do {
            cVar9 = cmMakefile::GetDefinition(local_310,psVar8);
            id = extraout_EDX_01;
            if ((cVar9.Value != (string *)0x0) && ((cVar9.Value)->_M_string_length != 0)) {
              if (PVar5 == WARN) {
                if (((ulong)local_a0 & 1) == 0) {
                  std::__cxx11::string::append((char *)&local_128);
                  std::__cxx11::string::_M_append
                            ((char *)&local_128,(ulong)(psVar8->_M_dataplus)._M_p);
                  id = extraout_EDX_02;
                }
              }
              else {
                cmMakefile::AddDefinition(local_310,psVar8,(string_view)(ZEXT816(0x756ed5) << 0x40))
                ;
                id = extraout_EDX_03;
              }
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != (string *)uVar10);
        }
        pcVar18 = local_310;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_string_length !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b8,(cmPolicies *)0x30,id);
          local_298._0_8_ = local_2b8._M_string_length;
          local_298._8_8_ = local_2b8._M_dataplus._M_p;
          local_288._0_8_ = (_Map_pointer)0x31;
          local_288._8_8_ = "\nThe following variable(s) would be set to empty:";
          local_278[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_128._M_string_length;
          local_278[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_128._M_dataplus._M_p;
          views_00._M_len = 3;
          views_00._M_array = (iterator)local_298;
          cmCatViews_abi_cxx11_(&local_2e8,views_00);
          cmMakefile::IssueMessage(pcVar18,AUTHOR_WARNING,&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                     local_2b8.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_338);
      }
    }
    else {
      if (PVar5 < NEW) {
        local_298._0_8_ = (cmMakefile *)local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"VERSION not allowed unless CMP0048 is set to NEW","");
        cmMakefile::IssueMessage(pcVar18,FATAL_ERROR,(string *)local_298);
        goto LAB_003460a3;
      }
      local_1e8[0]._M_nxt = (_Hash_node_base *)0x0;
      local_1d8 = (__node_base *)0x0;
      local_1d0 = 0;
      memset((RegularExpression *)local_298,0,0xaa);
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_298,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      cVar3 = cmsys::RegularExpression::find
                        ((RegularExpression *)local_298,local_50._M_dataplus._M_p,
                         (RegularExpressionMatch *)local_298);
      pbVar26 = &local_128;
      if ((bool)cVar3) {
        PVar5 = cmMakefile::GetPolicyStatus(pcVar18,CMP0096,false);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        local_2b8._M_string_length = 0;
        local_2b8.field_2._M_local_buf[0] = '\0';
        lVar16 = 0x10;
        do {
          puVar15 = (undefined1 *)((long)&local_128._M_dataplus._M_p + lVar16);
          *(undefined1 **)
           ((long)&local_148.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar16) = puVar15;
          *(undefined8 *)((long)&uStack_130 + lVar16) = 0;
          *puVar15 = 0;
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x90);
        local_150 = (_Base_ptr)CONCAT71(local_150._1_7_,cVar3);
        if (PVar5 < NEW) {
          local_338._0_8_ = (string *)0x0;
          local_338._8_8_ = (string *)0x0;
          iVar6 = __isoc99_sscanf(local_50._M_dataplus._M_p,"%u.%u.%u.%u",local_338,local_338 + 4,
                                  local_338 + 8,local_338 + 0xc);
          psVar8 = &local_2e8;
          lVar16 = 0;
          do {
            if (lVar16 < iVar6) {
              snprintf((char *)psVar8,0xb,"%u",(ulong)*(uint *)(local_338 + lVar16 * 4));
              std::__cxx11::string::append((char *)&local_2b8);
              std::__cxx11::string::append((char *)&local_2b8);
              pcVar14 = (char *)pbVar26->_M_string_length;
              strlen((char *)psVar8);
              std::__cxx11::string::_M_replace((ulong)pbVar26,0,pcVar14,(ulong)psVar8);
            }
            else {
              *(undefined1 *)&(psVar8->_M_dataplus)._M_p = 0;
            }
            lVar16 = lVar16 + 1;
            pbVar26 = pbVar26 + 1;
            psVar8 = (string *)((long)&psVar8->_M_string_length + 3);
          } while (lVar16 != 4);
        }
        else {
          std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_50);
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2e8,&local_2b8,'.',false);
          if ((pointer)local_2e8._M_string_length != local_2e8._M_dataplus._M_p) {
            uVar24 = 0;
            uVar17 = 1;
            do {
              std::__cxx11::string::operator=
                        ((string *)(&local_128 + uVar24),
                         (string *)(local_2e8._M_dataplus._M_p + uVar24 * 0x20));
              bVar2 = uVar17 < (ulong)((long)(local_2e8._M_string_length -
                                             (long)local_2e8._M_dataplus._M_p) >> 5);
              uVar24 = uVar17;
              uVar17 = (ulong)((int)uVar17 + 1);
            } while (bVar2);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2e8);
        }
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,local_318,"_VERSION");
        pcVar18 = local_310;
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        psVar8 = (string *)(local_338 + 0x10);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"PROJECT_VERSION","");
        value_02._M_str = local_2b8._M_dataplus._M_p;
        value_02._M_len = local_2b8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,(string *)local_338,value_02);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_03._M_str = local_2b8._M_dataplus._M_p;
        value_03._M_len = local_2b8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,&local_2e8,value_03);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,local_318,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_MAJOR","");
        value_04._M_str = local_128._M_dataplus._M_p;
        value_04._M_len = local_128._M_string_length;
        cmMakefile::AddDefinition(pcVar18,(string *)local_338,value_04);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_05._M_str = local_128._M_dataplus._M_p;
        value_05._M_len = local_128._M_string_length;
        cmMakefile::AddDefinition(pcVar18,&local_2e8,value_05);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,local_318,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_MINOR","");
        value_06._M_str = local_108._M_dataplus._M_p;
        value_06._M_len = local_108._M_string_length;
        cmMakefile::AddDefinition(pcVar18,(string *)local_338,value_06);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_07._M_str = local_108._M_dataplus._M_p;
        value_07._M_len = local_108._M_string_length;
        cmMakefile::AddDefinition(pcVar18,&local_2e8,value_07);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,local_318,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_PATCH","");
        value_08._M_str = local_e8._M_dataplus._M_p;
        value_08._M_len = local_e8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,(string *)local_338,value_08);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_09._M_str = local_e8._M_dataplus._M_p;
        value_09._M_len = local_e8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,&local_2e8,value_09);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_338,local_318,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_338);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"PROJECT_VERSION_TWEAK","");
        value_10._M_str = local_c8._M_dataplus._M_p;
        value_10._M_len = local_c8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,(string *)local_338,value_10);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        value_11._M_str = local_c8._M_dataplus._M_p;
        value_11._M_len = local_c8._M_string_length;
        cmMakefile::AddDefinition(pcVar18,&local_2e8,value_11);
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION","");
        TopLevelCMakeVarCondSet(pcVar18,(string *)local_338,&local_2b8);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_MAJOR","");
        TopLevelCMakeVarCondSet(pcVar18,(string *)local_338,&local_128);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_MINOR","");
        TopLevelCMakeVarCondSet(pcVar18,(string *)local_338,&local_108);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_PATCH","");
        TopLevelCMakeVarCondSet(pcVar18,(string *)local_338,&local_e8);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        local_338._0_8_ = psVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_338,"CMAKE_PROJECT_VERSION_TWEAK","");
        TopLevelCMakeVarCondSet(pcVar18,(string *)local_338,&local_c8);
        if ((string *)local_338._0_8_ != psVar8) {
          operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        lVar16 = -0x80;
        paVar19 = &local_c8.field_2;
        cVar3 = (char)local_150;
        do {
          if (paVar19 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar19->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar19->_M_allocated_capacity)[-2],
                            paVar19->_M_allocated_capacity + 1);
          }
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar19->_M_allocated_capacity + -4);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0);
        pcVar18 = local_310;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,
                          CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                   local_2b8.field_2._M_local_buf[0]) + 1);
          pcVar18 = local_310;
        }
      }
      else {
        std::operator+(&local_2e8,"VERSION \"",&local_50);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e8);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar19) {
          local_128.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_128.field_2._8_8_ = puVar12[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_128._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_128._M_string_length = puVar12[1];
        *puVar12 = paVar19;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        cmMakefile::IssueMessage(pcVar18,FATAL_ERROR,&local_128);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1d8 != (__node_base *)0x0) {
        operator_delete__(local_1d8);
      }
      bVar2 = true;
      if (cVar3 == '\0') goto LAB_003465b2;
    }
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_DESCRIPTION","");
    value_12._M_str = (char *)local_78._M_allocated_capacity;
    value_12._M_len = local_78._8_8_;
    cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_12);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    pcVar1 = (local_318->_M_dataplus)._M_p;
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,pcVar1,pcVar1 + local_318->_M_string_length);
    std::__cxx11::string::append(local_298);
    value_13._M_str = (char *)local_78._M_allocated_capacity;
    value_13._M_len = local_78._8_8_;
    cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_13);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"CMAKE_PROJECT_DESCRIPTION","");
    TopLevelCMakeVarCondSet(pcVar18,(string *)local_298,(string *)&local_78);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"PROJECT_HOMEPAGE_URL","");
    value_14._M_str = (char *)local_98._0_8_;
    value_14._M_len = local_98._8_8_;
    cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_14);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    pcVar1 = (local_318->_M_dataplus)._M_p;
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,pcVar1,pcVar1 + local_318->_M_string_length);
    std::__cxx11::string::append(local_298);
    value_15._M_str = (char *)local_98._0_8_;
    value_15._M_len = local_98._8_8_;
    cmMakefile::AddDefinition(pcVar18,(string *)local_298,value_15);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"CMAKE_PROJECT_HOMEPAGE_URL","");
    TopLevelCMakeVarCondSet(pcVar18,(string *)local_298,(string *)local_98);
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_298._0_8_ = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"C","");
      paVar19 = &local_268;
      local_278[0] = paVar19;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CXX","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_148,
                 local_298,&local_258);
      lVar16 = -0x40;
      do {
        if (paVar19 !=
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)(paVar19->_M_local_buf + -0x10)) {
          operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            **)(paVar19->_M_local_buf + -0x10),paVar19->_M_allocated_capacity + 1);
        }
        paVar19 = paVar19 + -2;
        lVar16 = lVar16 + 0x20;
        pcVar18 = local_310;
      } while (lVar16 != 0);
    }
    cmMakefile::EnableLanguage(pcVar18,&local_148,false);
    local_298._0_8_ = (cmMakefile *)local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_PROJECT_INCLUDE","");
    bVar2 = IncludeByVariable(local_58,(string *)local_298);
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    if (bVar2) {
      std::operator+(&local_128,"CMAKE_PROJECT_",local_318);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
      pcVar18 = (cmMakefile *)(puVar12 + 2);
      if ((cmMakefile *)*puVar12 == pcVar18) {
        local_288._0_8_ =
             (pcVar18->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_288._8_8_ = puVar12[3];
        local_298._0_8_ = (cmMakefile *)local_288;
      }
      else {
        local_288._0_8_ =
             (pcVar18->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_map;
        local_298._0_8_ = (cmMakefile *)*puVar12;
      }
      local_298._8_8_ = puVar12[1];
      *puVar12 = pcVar18;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      bVar2 = IncludeByVariable(local_58,(string *)local_298);
      if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
        operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    local_298._0_8_ = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,"");
    cmMakefile::IssueMessage(pcVar18,FATAL_ERROR,(string *)local_298);
LAB_003460a3:
    if ((cmMakefile *)local_298._0_8_ != (cmMakefile *)local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar2 = true;
  }
LAB_003465b2:
  if (local_2f8 != (_Map_pointer)0x0) {
    (*(code *)local_2f8)(&local_308,&local_308,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool cmProjectCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE_BEFORE")) {
    return false;
  }

  mf.SetProjectName(projectName);

  mf.AddCacheDefinition(projectName + "_BINARY_DIR",
                        mf.GetCurrentBinaryDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);
  mf.AddCacheDefinition(projectName + "_SOURCE_DIR",
                        mf.GetCurrentSourceDirectory(),
                        "Value Computed by CMake", cmStateEnums::STATIC);

  mf.AddDefinition("PROJECT_BINARY_DIR", mf.GetCurrentBinaryDirectory());
  mf.AddDefinition("PROJECT_SOURCE_DIR", mf.GetCurrentSourceDirectory());

  mf.AddDefinition("PROJECT_NAME", projectName);

  mf.AddDefinitionBool("PROJECT_IS_TOP_LEVEL", mf.IsRootMakefile());
  mf.AddCacheDefinition(projectName + "_IS_TOP_LEVEL",
                        mf.IsRootMakefile() ? "ON" : "OFF",
                        "Value Computed by CMake", cmStateEnums::STATIC);

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!mf.GetDefinition("CMAKE_PROJECT_NAME") || mf.IsRootMakefile()) {
    mf.RemoveDefinition("CMAKE_PROJECT_NAME");
    mf.AddCacheDefinition("CMAKE_PROJECT_NAME", projectName,
                          "Value Computed by CMake", cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg = cmStrCat(
          "the following parameters must be specified after LANGUAGES "
          "keyword: ",
          cmJoin(languages, ", "), '.');
        mf.IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        mf.IssueMessage(MessageType::FATAL_ERROR,
                        "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [&mf, &resetReporter]() {
        mf.IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
                    "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus const cmp0048 =
    mf.GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      mf.IssueMessage(MessageType::FATAL_ERROR,
                      "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = R"(VERSION ")" + version + R"(" format invalid.)";
      mf.IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }

    cmPolicies::PolicyStatus const cmp0096 =
      mf.GetPolicyStatus(cmPolicies::CMP0096);

    constexpr std::size_t MAX_VERSION_COMPONENTS = 4u;
    std::string version_string;
    std::array<std::string, MAX_VERSION_COMPONENTS> version_components;

    if (cmp0096 == cmPolicies::OLD || cmp0096 == cmPolicies::WARN) {
      constexpr size_t maxIntLength =
        std::numeric_limits<unsigned>::digits10 + 2;
      char vb[MAX_VERSION_COMPONENTS][maxIntLength];
      unsigned v[MAX_VERSION_COMPONENTS] = { 0, 0, 0, 0 };
      const int vc = std::sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1],
                                 &v[2], &v[3]);
      for (auto i = 0u; i < MAX_VERSION_COMPONENTS; ++i) {
        if (static_cast<int>(i) < vc) {
          std::snprintf(vb[i], maxIntLength, "%u", v[i]);
          version_string += &"."[static_cast<std::size_t>(i == 0)];
          version_string += vb[i];
          version_components[i] = vb[i];
        } else {
          vb[i][0] = '\x00';
        }
      }
    } else {
      // The regex above verified that we have a .-separated string of
      // non-negative integer components.  Keep the original string.
      version_string = std::move(version);
      // Split the integer components.
      auto components = cmSystemTools::SplitString(version_string, '.');
      for (auto i = 0u; i < components.size(); ++i) {
        version_components[i] = std::move(components[i]);
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    mf.AddDefinition("PROJECT_VERSION", version_string);
    mf.AddDefinition(vv, version_string);
    vv = projectName + "_VERSION_MAJOR";
    mf.AddDefinition("PROJECT_VERSION_MAJOR", version_components[0]);
    mf.AddDefinition(vv, version_components[0]);
    vv = projectName + "_VERSION_MINOR";
    mf.AddDefinition("PROJECT_VERSION_MINOR", version_components[1]);
    mf.AddDefinition(vv, version_components[1]);
    vv = projectName + "_VERSION_PATCH";
    mf.AddDefinition("PROJECT_VERSION_PATCH", version_components[2]);
    mf.AddDefinition(vv, version_components[2]);
    vv = projectName + "_VERSION_TWEAK";
    mf.AddDefinition("PROJECT_VERSION_TWEAK", version_components[3]);
    mf.AddDefinition(vv, version_components[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION", version_string);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MAJOR",
                            version_components[0]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_MINOR",
                            version_components[1]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_PATCH",
                            version_components[2]);
    TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_VERSION_TWEAK",
                            version_components[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv = { "PROJECT_VERSION",
                                    "PROJECT_VERSION_MAJOR",
                                    "PROJECT_VERSION_MINOR",
                                    "PROJECT_VERSION_PATCH",
                                    "PROJECT_VERSION_TWEAK",
                                    projectName + "_VERSION",
                                    projectName + "_VERSION_MAJOR",
                                    projectName + "_VERSION_MINOR",
                                    projectName + "_VERSION_PATCH",
                                    projectName + "_VERSION_TWEAK" };
    if (mf.IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      cmValue v = mf.GetDefinition(i);
      if (cmNonempty(v)) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          mf.AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      mf.IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0048),
                 "\nThe following variable(s) would be set to empty:", vw));
    }
  }

  mf.AddDefinition("PROJECT_DESCRIPTION", description);
  mf.AddDefinition(projectName + "_DESCRIPTION", description);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_DESCRIPTION", description);

  mf.AddDefinition("PROJECT_HOMEPAGE_URL", homepage);
  mf.AddDefinition(projectName + "_HOMEPAGE_URL", homepage);
  TopLevelCMakeVarCondSet(mf, "CMAKE_PROJECT_HOMEPAGE_URL", homepage);

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages = { "C", "CXX" };
  }
  mf.EnableLanguage(languages, false);

  if (!IncludeByVariable(status, "CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!IncludeByVariable(status,
                         "CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}